

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Bool prvTidyWarnMissingSIInEmittedDocType(TidyDocImpl *doc)

{
  uint uVar1;
  long lVar2;
  AttVal *pAVar3;
  long lVar4;
  long lVar5;
  Node *node;
  
  if (doc->lexer->isvoyager == no) {
    uVar1 = doc->lexer->versionEmitted;
    if (uVar1 != 1) {
      lVar4 = 0x1ca718;
      lVar2 = 0;
      do {
        lVar5 = lVar2;
        if (lVar5 + 0x28 == 0x2f8) goto LAB_00145a01;
        lVar2 = lVar5 + 0x28;
      } while (*(uint *)((long)&W3C_Doctypes[1].vers + lVar5) != uVar1);
      lVar4 = lVar5 + 0x1ca448;
LAB_00145a01:
      if (*(long *)(lVar4 + 0x10) == 0) {
        return no;
      }
    }
    lVar4 = 0x20;
    do {
      if (*(uint *)((long)&entities[0x7ef].name + lVar4 + 4) == uVar1) {
        if (*(long *)((long)&W3C_Doctypes[0].score + lVar4) == 0) {
          return no;
        }
        if (doc == (TidyDocImpl *)0x0) {
          return no;
        }
        node = (doc->root).content;
        while( true ) {
          if (node == (Node *)0x0) {
            return no;
          }
          if (node->type == DocTypeTag) break;
          node = node->next;
        }
        pAVar3 = prvTidyGetAttrByName(node,"SYSTEM");
        if (pAVar3 != (AttVal *)0x0) {
          return no;
        }
        return yes;
      }
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0x318);
  }
  return no;
}

Assistant:

Bool TY_(WarnMissingSIInEmittedDocType)( TidyDocImpl* doc )
{
    Bool isXhtml = doc->lexer->isvoyager;
    Node* doctype;
    
    /* Do not warn in XHTML mode */
    if ( isXhtml )
        return no;

    /* Do not warn if emitted doctype is proprietary */
    if ( TY_(HTMLVersionNameFromCode)(doc->lexer->versionEmitted, isXhtml ) == NULL )
        return no;

    /* Do not warn if no SI is possible */
    if ( GetSIFromVers(doc->lexer->versionEmitted) == NULL )
        return no;

    if ( (doctype = TY_(FindDocType)( doc )) != NULL
         && TY_(GetAttrByName)(doctype, "SYSTEM") == NULL )
        return yes;

    return no;
}